

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  uint *puVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int in_ESI;
  undefined8 *in_RDI;
  int c;
  int v_max;
  int h_max;
  int q;
  int i;
  int p;
  int Lf;
  stbi__context *s;
  stbi__context *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_34;
  int local_2c;
  int local_4;
  
  puVar1 = (uint *)*in_RDI;
  local_34 = 1;
  local_38 = 1;
  iVar4 = stbi__get16be((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar4 < 0xb) {
    local_4 = stbi__err("bad SOF len");
  }
  else {
    sVar2 = stbi__get8(in_stack_ffffffffffffffb8);
    if (sVar2 == '\b') {
      uVar5 = stbi__get16be((stbi__context *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      puVar1[1] = uVar5;
      if (puVar1[1] == 0) {
        local_4 = stbi__err("no header height");
      }
      else {
        uVar5 = stbi__get16be((stbi__context *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        *puVar1 = uVar5;
        if (*puVar1 == 0) {
          local_4 = stbi__err("0 width");
        }
        else {
          bVar3 = stbi__get8(in_stack_ffffffffffffffb8);
          uVar5 = (uint)bVar3;
          if ((uVar5 == 3) || (uVar5 == 1)) {
            puVar1[2] = uVar5;
            for (local_2c = 0; local_2c < (int)uVar5; local_2c = local_2c + 1) {
              in_RDI[(long)local_2c * 0xc + 0x8ba] = 0;
              in_RDI[(long)local_2c * 0xc + 0x8bd] = 0;
            }
            if (iVar4 == puVar1[2] * 3 + 8) {
              for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                bVar3 = stbi__get8(in_stack_ffffffffffffffb8);
                *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8b4) = (uint)bVar3;
                if ((*(int *)(in_RDI + (long)local_2c * 0xc + 0x8b4) != local_2c + 1) &&
                   (*(int *)(in_RDI + (long)local_2c * 0xc + 0x8b4) != local_2c)) {
                  iVar4 = stbi__err("bad component ID");
                  return iVar4;
                }
                bVar3 = stbi__get8(in_stack_ffffffffffffffb8);
                *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4) = (int)(uint)bVar3 >> 4;
                if ((*(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4) == 0) ||
                   (4 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4))) {
                  iVar4 = stbi__err("bad H");
                  return iVar4;
                }
                *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8b5) = bVar3 & 0xf;
                if ((*(int *)(in_RDI + (long)local_2c * 0xc + 0x8b5) == 0) ||
                   (4 < *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b5))) {
                  iVar4 = stbi__err("bad V");
                  return iVar4;
                }
                bVar3 = stbi__get8(in_stack_ffffffffffffffb8);
                *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x45ac) = (uint)bVar3;
                if (3 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45ac)) {
                  iVar4 = stbi__err("bad TQ");
                  return iVar4;
                }
              }
              if (in_ESI == 0) {
                if ((uint)((0x40000000 / (ulong)*puVar1) / (ulong)puVar1[2]) < puVar1[1]) {
                  local_4 = stbi__err("too large");
                }
                else {
                  for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                    if ((int)local_34 < *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4)) {
                      local_34 = *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4);
                    }
                    if ((int)local_38 < *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b5)) {
                      local_38 = *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8b5);
                    }
                  }
                  *(uint *)(in_RDI + 0x8b1) = local_34;
                  *(uint *)((long)in_RDI + 0x458c) = local_38;
                  *(uint *)(in_RDI + 0x8b3) = local_34 << 3;
                  *(uint *)((long)in_RDI + 0x459c) = local_38 << 3;
                  *(uint *)(in_RDI + 0x8b2) =
                       ((*puVar1 + *(int *)(in_RDI + 0x8b3)) - 1) / *(uint *)(in_RDI + 0x8b3);
                  *(uint *)((long)in_RDI + 0x4594) =
                       ((puVar1[1] + *(int *)((long)in_RDI + 0x459c)) - 1) /
                       *(uint *)((long)in_RDI + 0x459c);
                  for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
                    *(uint *)((long)in_RDI + (long)local_2c * 0x60 + 0x45bc) =
                         ((*puVar1 * *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4) +
                          local_34) - 1) / local_34;
                    *(uint *)(in_RDI + (long)local_2c * 0xc + 0x8b8) =
                         ((puVar1[1] * *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b5) + local_38) -
                         1) / local_38;
                    *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45c4) =
                         *(int *)(in_RDI + 0x8b2) *
                         *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45a4) * 8;
                    *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b9) =
                         *(int *)((long)in_RDI + 0x4594) *
                         *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b5) * 8;
                    pvVar6 = stbi__malloc(0x1176f1);
                    in_RDI[(long)local_2c * 0xc + 0x8bb] = pvVar6;
                    if (in_RDI[(long)local_2c * 0xc + 0x8bb] == 0) {
                      while (local_2c = local_2c + -1, -1 < local_2c) {
                        free((void *)in_RDI[(long)local_2c * 0xc + 0x8bb]);
                        in_RDI[(long)local_2c * 0xc + 0x8ba] = 0;
                      }
                      iVar4 = stbi__err("outofmem");
                      return iVar4;
                    }
                    in_RDI[(long)local_2c * 0xc + 0x8ba] =
                         in_RDI[(long)local_2c * 0xc + 0x8bb] + 0xf & 0xfffffffffffffff0;
                    in_RDI[(long)local_2c * 0xc + 0x8bd] = 0;
                    if (*(int *)(in_RDI + 0x8e6) == 0) {
                      in_RDI[(long)local_2c * 0xc + 0x8be] = 0;
                      in_RDI[(long)local_2c * 0xc + 0x8bc] = 0;
                    }
                    else {
                      *(int *)(in_RDI + (long)local_2c * 0xc + 0x8bf) =
                           *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45c4) + 7 >> 3;
                      *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45fc) =
                           *(int *)(in_RDI + (long)local_2c * 0xc + 0x8b9) + 7 >> 3;
                      pvVar6 = malloc((long)(*(int *)(in_RDI + (long)local_2c * 0xc + 0x8bf) *
                                             *(int *)((long)in_RDI + (long)local_2c * 0x60 + 0x45fc)
                                            * 0x40) * 2 + 0xf);
                      in_RDI[(long)local_2c * 0xc + 0x8bc] = pvVar6;
                      in_RDI[(long)local_2c * 0xc + 0x8be] =
                           in_RDI[(long)local_2c * 0xc + 0x8bc] + 0xf & 0xfffffffffffffff0;
                    }
                  }
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = stbi__err("bad SOF len");
            }
          }
          else {
            local_4 = stbi__err("bad component count");
          }
        }
      }
    }
    else {
      local_4 = stbi__err("only 8-bit");
    }
  }
  return local_4;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1) return stbi__err("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   for (i=0; i < s->img_n; ++i) {
      z->img_comp[i].id = stbi__get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i)  // some version of jpegtran outputs non-JFIF-compliant files!
            return stbi__err("bad component ID","Corrupt JPEG");
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = stbi__malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);

      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            STBI_FREE(z->img_comp[i].raw_data);
            z->img_comp[i].data = NULL;
         }
         return stbi__err("outofmem", "Out of memory");
      }
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
      if (z->progressive) {
         z->img_comp[i].coeff_w = (z->img_comp[i].w2 + 7) >> 3;
         z->img_comp[i].coeff_h = (z->img_comp[i].h2 + 7) >> 3;
         z->img_comp[i].raw_coeff = STBI_MALLOC(z->img_comp[i].coeff_w * z->img_comp[i].coeff_h * 64 * sizeof(short) + 15);
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      } else {
         z->img_comp[i].coeff = 0;
         z->img_comp[i].raw_coeff = 0;
      }
   }

   return 1;
}